

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::run(LegalizeJSInterface *this,Module *module)

{
  variant<wasm::Name,_wasm::HeapType> value;
  Name name_00;
  Name name_01;
  Module *this_00;
  bool bVar1;
  reference this_01;
  pointer pEVar2;
  Name *this_02;
  Function *pFVar3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_03;
  reference ppFVar4;
  Function *pFVar5;
  mapped_type *ppFVar6;
  PassRunner *pPVar7;
  reference ppVar8;
  Name NVar9;
  pair<const_wasm::Name,_wasm::Function_*> *pair;
  iterator __end3;
  iterator __begin3;
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *__range3;
  Fixer fixer;
  Function *func_2;
  Function *im;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2_3;
  reference local_208;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2_2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2_1;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  size_t local_198;
  char *pcStack_190;
  value_type local_180;
  string local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 auStack_110 [8];
  Name newName;
  Builder builder;
  undefined1 local_e8 [8];
  Name legalName;
  Function *func;
  Name *name;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  newExports;
  string local_78;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  Module *pMStack_18;
  bool exportOriginals;
  Module *module_local;
  LegalizeJSInterface *this_local;
  
  this->setTempRet0 = (Function *)0x0;
  this->getTempRet0 = (Function *)0x0;
  pMStack_18 = module;
  module_local = (Module *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"legalize-js-interface-export-originals",&local_41);
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_19 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"legalize-js-interface-exported-helpers",
             (allocator<char> *)
             ((long)&newExports.
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_78);
  this->exportedHelpers = bVar1;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&newExports.
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::vector((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            *)&__range2);
  this_00 = pMStack_18;
  __end2 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&pMStack_18->exports);
  ex = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
       std::
       vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ::end(&this_00->exports);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                     *)&ex), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end2);
    pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_01);
    if (pEVar2->kind == Function) {
      pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_01);
      this_02 = Export::getInternalName(pEVar2);
      legalName.super_IString.str._M_str = (char *)(this_02->super_IString).str._M_len;
      pFVar3 = Module::getFunction(pMStack_18,(Name)(this_02->super_IString).str);
      bVar1 = isIllegal<wasm::Function>(this,pFVar3);
      if (bVar1) {
        NVar9 = makeLegalStub(this,pFVar3,pMStack_18);
        legalName.super_IString.str._M_len = NVar9.super_IString.str._M_str;
        local_e8 = NVar9.super_IString.str._M_len;
        wasm::Name::operator=(this_02,(Name *)local_e8);
        if (((local_19 & 1) != 0) &&
           (bVar1 = Importable::imported(&pFVar3->super_Importable), !bVar1)) {
          pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (this_01);
          bVar1 = isDynCall(this,(Name)(pEVar2->name).super_IString.str);
          if (!bVar1) {
            Builder::Builder((Builder *)&newName.super_IString.str._M_str,pMStack_18);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_150,"orig$",&local_151);
            pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                               (this_01);
            IString::toString_abi_cxx11_(&local_178,(IString *)pEVar2);
            std::operator+(&local_130,&local_150,&local_178);
            wasm::Name::Name((Name *)auStack_110,&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_150);
            std::allocator<char>::~allocator(&local_151);
            local_198 = (size_t)auStack_110;
            pcStack_190 = (char *)newName.super_IString.str._M_len;
            std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
                      ((variant<wasm::Name,wasm::HeapType> *)&__range2_1,(Name *)pFVar3);
            name_01.super_IString.str._M_str = pcStack_190;
            name_01.super_IString.str._M_len = local_198;
            value.super__Variant_base<wasm::Name,_wasm::HeapType>.
            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
            super_IString.str._M_str = (char *)uStack_1a8;
            value.super__Variant_base<wasm::Name,_wasm::HeapType>.
            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
            super_IString.str._M_len = (size_t)__range2_1;
            value.super__Variant_base<wasm::Name,_wasm::HeapType>.
            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_1a0;
            Builder::makeExport((Builder *)&local_180,name_01,value,Function);
            std::
            vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ::push_back((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         *)&__range2,&local_180);
            std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                      (&local_180);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      *)&__range2);
  ex_1 = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
         std::
         vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ::end((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                             *)&ex_1), bVar1) {
    originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                  ::operator*(&__end2_1);
    Module::addExport(pMStack_18,
                      (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                      originalFunctions.
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  this_03 = &pMStack_18->functions;
  __end2_2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(this_03);
  func_1 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(this_03);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                             *)&func_1), bVar1) {
    local_208 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                ::operator*(&__end2_2);
    __range2_3 = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                 std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                           (local_208);
    std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
              ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2,
               (value_type *)&__range2_3);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                       ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  im = (Function *)
       std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                 ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_3,
                            (__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                             *)&im), bVar1) {
    ppFVar4 = __gnu_cxx::
              __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator*(&__end2_3);
    pFVar3 = *ppFVar4;
    bVar1 = Importable::imported(&pFVar3->super_Importable);
    if ((bVar1) && (bVar1 = isIllegal<wasm::Function>(this,pFVar3), bVar1)) {
      pFVar5 = makeLegalStubForCalledImport(this,pFVar3,pMStack_18);
      fixer.illegalImportsToLegal =
           (unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
            *)pFVar5;
      ppFVar6 = std::
                unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
                ::operator[](&this->illegalImportsToLegal,(key_type *)pFVar3);
      *ppFVar6 = pFVar5;
    }
    __gnu_cxx::
    __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
    ::operator++(&__end2_3);
  }
  bVar1 = std::
          unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
          ::empty(&this->illegalImportsToLegal);
  if (!bVar1) {
    wasm::(anonymous_namespace)::LegalizeJSInterface::run(wasm::Module*)::Fixer::Fixer(std::
    unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
    allocator<std::pair<wasm::Name_const,wasm::Function_>_>_>__
              (&__range3,&this->illegalImportsToLegal);
    pPVar7 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_>::run
              ((WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_> *)&__range3,pPVar7
               ,pMStack_18);
    pPVar7 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_>::runOnModuleCode
              ((WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_> *)&__range3,pPVar7
               ,pMStack_18);
    __end3 = std::
             unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
             ::begin(&this->illegalImportsToLegal);
    pair = (pair<const_wasm::Name,_wasm::Function_*> *)
           std::
           unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
           ::end(&this->illegalImportsToLegal);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                              ,(_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Function_*>,_true>
                                *)&pair), bVar1) {
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>::operator*
                         (&__end3);
      Module::removeFunction(pMStack_18,(Name)(ppVar8->first).super_IString.str);
      std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Function_*>,_false,_true>::
      operator++(&__end3);
    }
    run::Fixer::~Fixer((Fixer *)&__range3);
  }
  name_00.super_IString.str._M_str = DAT_03193a08;
  name_00.super_IString.str._M_len = wasm::(anonymous_namespace)::GET_TEMP_RET_EXPORT;
  Module::removeExport(pMStack_18,name_00);
  NVar9.super_IString.str._M_str = DAT_03193a18;
  NVar9.super_IString.str._M_len = wasm::(anonymous_namespace)::SET_TEMP_RET_EXPORT;
  Module::removeExport(pMStack_18,NVar9);
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector
            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range2_2);
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::~vector((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             *)&__range2);
  return;
}

Assistant:

void run(Module* module) override {
    setTempRet0 = nullptr;
    getTempRet0 = nullptr;
    auto exportOriginals =
      hasArgument("legalize-js-interface-export-originals");
    exportedHelpers = hasArgument("legalize-js-interface-exported-helpers");
    // for each illegal export, we must export a legalized stub instead
    std::vector<std::unique_ptr<Export>> newExports;
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function) {
        // if it's an import, ignore it
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        if (isIllegal(func)) {
          // Provide a legal function for the export.
          auto legalName = makeLegalStub(func, module);
          *name = legalName;
          if (exportOriginals) {
            // Also export the original function, before legalization. This is
            // not normally useful for JS, except in cases like dynamic linking
            // where the JS loader code must copy exported wasm functions into
            // the table, and they must not be legalized as other wasm code will
            // do an indirect call to them. However, don't do this for imported
            // functions, as those would be legalized in their actual module
            // anyhow. It also makes no sense to do this for dynCalls, as they
            // are only called from JS.
            if (!func->imported() && !isDynCall(ex->name)) {
              Builder builder(*module);
              Name newName = std::string("orig$") + ex->name.toString();
              newExports.push_back(builder.makeExport(
                newName, func->name, ExternalKind::Function));
            }
          }
        }
      }
    }

    for (auto& ex : newExports) {
      module->addExport(std::move(ex));
    }
    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // for each illegal import, we must call a legalized stub instead
    for (auto* im : originalFunctions) {
      if (im->imported() && isIllegal(im)) {
        auto* func = makeLegalStubForCalledImport(im, module);
        illegalImportsToLegal[im->name] = func;
      }
    }

    if (!illegalImportsToLegal.empty()) {
      // fix up imports: call of an illegal import must be turned to a call of a
      // legal import. the same must be done with ref.funcs.
      struct Fixer : public WalkerPass<PostWalker<Fixer>> {
        bool isFunctionParallel() override { return true; }

        std::unique_ptr<Pass> create() override {
          return std::make_unique<Fixer>(illegalImportsToLegal);
        }

        std::unordered_map<Name, Function*>& illegalImportsToLegal;

        Fixer(std::unordered_map<Name, Function*>& illegalImportsToLegal)
          : illegalImportsToLegal(illegalImportsToLegal) {}

        void visitCall(Call* curr) {
          auto iter = illegalImportsToLegal.find(curr->target);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          replaceCurrent(Builder(*getModule())
                           .makeCall(iter->second->name,
                                     curr->operands,
                                     curr->type,
                                     curr->isReturn));
        }

        void visitRefFunc(RefFunc* curr) {
          auto iter = illegalImportsToLegal.find(curr->func);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          curr->func = iter->second->name;
          // TODO: Make this exact.
          curr->type = Type(iter->second->type, NonNullable);
        }
      };

      Fixer fixer(illegalImportsToLegal);
      fixer.run(getPassRunner(), module);
      fixer.runOnModuleCode(getPassRunner(), module);

      // Finally we can remove all the now-unused illegal imports
      for (const auto& pair : illegalImportsToLegal) {
        module->removeFunction(pair.first);
      }
    }

    module->removeExport(GET_TEMP_RET_EXPORT);
    module->removeExport(SET_TEMP_RET_EXPORT);
  }